

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.h
# Opt level: O3

void __thiscall QtPrivate::QWellArray::keyPressEvent(QWellArray *this,QKeyEvent *e)

{
  int iVar1;
  int iVar2;
  
  switch(*(int *)(e + 0x40)) {
  case 0x1000012:
    if (this->curCol < 1) {
      return;
    }
    iVar2 = this->curRow;
    iVar1 = this->curCol + -1;
    goto LAB_004cf7a9;
  case 0x1000013:
    if (this->curRow < 1) {
      return;
    }
    iVar2 = this->curRow + -1;
    break;
  case 0x1000014:
    if (this->ncols + -1 <= this->curCol) {
      return;
    }
    iVar2 = this->curRow;
    iVar1 = this->curCol + 1;
    goto LAB_004cf7a9;
  case 0x1000015:
    if (this->nrows + -1 <= this->curRow) {
      return;
    }
    iVar2 = this->curRow + 1;
    break;
  default:
    if (*(int *)(e + 0x40) != 0x20) {
      e[0xc] = (QKeyEvent)0x0;
      return;
    }
    (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this,this->curRow,this->curCol);
    return;
  }
  iVar1 = this->curCol;
LAB_004cf7a9:
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,iVar2,iVar1);
  return;
}

Assistant:

int key() const { return m_key; }